

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ImpactGenerator.cpp
# Opt level: O3

int ImpactGenerator::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  
  pfVar1 = (float *)(state->field_0).field_0.effectdata;
  if (pfVar1 == (float *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = ImpactGenerator::EffectData]"
                 );
  }
  if ((state->field_0).field_0.internal != (void *)0x0) {
    iVar2 = 1;
    if (index < 4) {
      pfVar1[index] = value;
      iVar2 = 0;
      if ((index == 3) && (iVar2 = 0, (uint)(int)*pfVar1 < 4)) {
        uVar3 = (ulong)(uint)(int)*pfVar1;
        if (*(char *)((long)&GetImpactInstance(int)::initialized + uVar3) == '\0') {
          *(undefined1 *)((long)&GetImpactInstance(int)::initialized + uVar3) = 1;
          *(undefined4 *)(GetImpactInstance(int)::instance + uVar3 * 0xbb94 + 8) = 0;
        }
        *(int *)(GetImpactInstance(int)::instance + uVar3 * 0xbb94 + 4) = (int)value;
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  __assert_fail("internal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                ,0xfe,
                "T *UnityAudioEffectState::GetEffectData() const [T = ImpactGenerator::EffectData]")
  ;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        if (index == P_MAXIMPACTS)
        {
            ImpactInstance* instance = GetImpactInstance((int)data->p[P_INSTANCE]);
            if (instance != NULL)
                instance->maximpacts = value;
        }
        return UNITY_AUDIODSP_OK;
    }